

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

char16 * Js::JavascriptString::AllocateAndCopySz
                   (ArenaAllocator *arena,char16 *content,charcount_t length)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  TrackAllocData local_50;
  char16_t *local_28;
  char16 *buffer;
  char16 *pcStack_18;
  charcount_t length_local;
  char16 *content_local;
  ArenaAllocator *arena_local;
  
  buffer._4_4_ = length;
  pcStack_18 = content;
  content_local = (char16 *)arena;
  if (0x7ffffffd < length) {
    Throw::OutOfMemory();
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&char16_t::typeinfo,0,(ulong)(length + 1),
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
             ,0xe8f);
  this = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                   (&arena->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                    ,&local_50);
  local_28 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                       ((Memory *)this,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)(buffer._4_4_ + 1));
  js_wmemcpy_s(local_28,(ulong)(buffer._4_4_ + 1),pcStack_18,(ulong)buffer._4_4_);
  local_28[buffer._4_4_] = L'\0';
  return local_28;
}

Assistant:

char16* JavascriptString::AllocateAndCopySz(__in ArenaAllocator* arena, __in_ecount(length) const char16* content, charcount_t length)
    {
        // Note: Intentionally not using SafeSzSize nor hoisting common
        // sub-expression "length + 1" into a local variable otherwise
        // Prefast gets confused and cannot track buffer's length.

        // JavascriptString::MaxCharLength is valid; however, we are incrementing below by 1 and want to make sure we aren't overflowing
        // Nor going outside of valid range.
        if (length >= JavascriptString::MaxCharLength)
        {
            Throw::OutOfMemory();
        }

        // Allocate arena memory to store the string plus a terminating NUL
        char16* buffer = AnewArray(arena, char16, length + 1);
        js_wmemcpy_s(buffer, length + 1, content, length);
        buffer[length] = _u('\0');

        return buffer;
    }